

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive_crypto.c
# Opt level: O0

void test_archive_md5(void)

{
  int iVar1;
  char *unaff_retaddr;
  void *in_stack_00000008;
  wchar_t in_stack_00000014;
  char *in_stack_00000018;
  uchar actualmd [17];
  char *in_stack_00000038;
  uchar md [16];
  uchar buf [1];
  archive_md5_ctx ctx;
  char *in_stack_ffffffffffffffb0;
  longlong in_stack_ffffffffffffffb8;
  wchar_t in_stack_ffffffffffffffc4;
  char *file;
  void *in_stack_ffffffffffffffe0;
  undefined1 local_18 [8];
  char *in_stack_fffffffffffffff0;
  void *in_stack_fffffffffffffff8;
  
  memset(&stack0xfffffffffffffffe,0,1);
  file = (char *)0x89a00dfead85b893;
  iVar1 = __archive_stub_md5init(&stack0xffffffffffffffff);
  if (iVar1 == 0) {
    __archive_stub_md5update(&stack0xffffffffffffffff,&stack0xfffffffffffffffe,1);
    assertion_equal_int(file,in_stack_ffffffffffffffc4,in_stack_ffffffffffffffb8,
                        in_stack_ffffffffffffffb0,0,(char *)0x12474b,in_stack_ffffffffffffffe0);
    __archive_stub_md5final(&stack0xffffffffffffffff,local_18);
    assertion_equal_int(file,in_stack_ffffffffffffffc4,in_stack_ffffffffffffffb8,
                        in_stack_ffffffffffffffb0,0,(char *)0x124790,in_stack_ffffffffffffffe0);
    assertion_equal_mem(in_stack_00000018,in_stack_00000014,in_stack_00000008,unaff_retaddr,
                        in_stack_fffffffffffffff8,in_stack_fffffffffffffff0,stack0x00000030,
                        in_stack_00000038,(void *)md._0_8_);
  }
  else {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_crypto.c"
                   ,L'*');
    test_skipping("This platform does not support MD5");
  }
  return;
}

Assistant:

DEFINE_TEST(test_archive_md5)
{
	archive_md5_ctx ctx;
	unsigned char buf[] = "";
	unsigned char md[16];
	unsigned char actualmd[] = "\x93\xb8\x85\xad\xfe\x0d\xa0\x89"
                             "\xcd\xf6\x34\x90\x4f\xd5\x9f\x71";

	if (ARCHIVE_OK != archive_md5_init(&ctx)) {
		skipping("This platform does not support MD5");
		return;
	}
	assertEqualInt(ARCHIVE_OK, archive_md5_update(&ctx, buf, sizeof(buf)));
	assertEqualInt(ARCHIVE_OK, archive_md5_final(&ctx, md));
	assertEqualMem(md, actualmd, sizeof(md));
}